

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vvcStreamReader.cpp
# Opt level: O1

void __thiscall VVCStreamReader::incTimings(VVCStreamReader *this)

{
  int64_t *piVar1;
  int iVar2;
  long lVar3;
  ostream *poVar4;
  
  iVar2 = (this->super_MPEGStreamReader).m_totalFrameNum;
  (this->super_MPEGStreamReader).m_totalFrameNum = iVar2 + 1;
  if (0 < iVar2) {
    piVar1 = &(this->super_MPEGStreamReader).m_curDts;
    *piVar1 = *piVar1 + (this->super_MPEGStreamReader).m_pcrIncPerFrame;
  }
  iVar2 = this->m_frameNum;
  lVar3 = (long)iVar2 - (long)this->m_fullPicOrder;
  (this->super_MPEGStreamReader).m_curPts =
       (this->super_MPEGStreamReader).m_curDts -
       lVar3 * (this->super_MPEGStreamReader).m_pcrIncPerFrame;
  this->m_frameNum = iVar2 + 1;
  this->m_firstFrame = false;
  iVar2 = (int)lVar3;
  if (this->m_frameDepth < iVar2) {
    this->m_frameDepth = iVar2;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"B-pyramid level ",0x10);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->m_frameDepth + -1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," detected. Shift DTS to ",0x18);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->m_frameDepth);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," frames",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    sLastMsg = true;
  }
  return;
}

Assistant:

void VVCStreamReader::incTimings()
{
    if (m_totalFrameNum++ > 0)
        m_curDts += m_pcrIncPerFrame;
    const int delta = m_frameNum - m_fullPicOrder;
    m_curPts = m_curDts - delta * m_pcrIncPerFrame;
    m_frameNum++;
    m_firstFrame = false;

    if (delta > m_frameDepth)
    {
        m_frameDepth = delta;
        LTRACE(LT_INFO, 2,
               "B-pyramid level " << m_frameDepth - 1 << " detected. Shift DTS to " << m_frameDepth << " frames");
    }
}